

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O2

RayDifferential * __thiscall
pbrt::AnimatedTransform::operator()
          (RayDifferential *__return_storage_ptr__,AnimatedTransform *this,RayDifferential *r,
          Float *tMax)

{
  float time;
  Transform t;
  
  if ((this->actuallyAnimated == true) && (time = (r->super_Ray).time, this->startTime < time)) {
    if (time < this->endTime) {
      Interpolate((Transform *)&stack0xffffffffffffff60,this,time);
      this = (AnimatedTransform *)&stack0xffffffffffffff60;
    }
    else {
      this = (AnimatedTransform *)&this->endTransform;
    }
  }
  Transform::operator()(__return_storage_ptr__,&this->startTransform,r,tMax);
  return __return_storage_ptr__;
}

Assistant:

RayDifferential AnimatedTransform::operator()(const RayDifferential &r,
                                              Float *tMax) const {
    if (!actuallyAnimated || r.time <= startTime)
        return startTransform(r, tMax);
    else if (r.time >= endTime)
        return endTransform(r, tMax);
    else {
        Transform t = Interpolate(r.time);
        return t(r, tMax);
    }
}